

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

Type * __thiscall
soul::AST::EndpointDetails::getElementDataType
          (Type *__return_storage_ptr__,EndpointDetails *this,Expression *e)

{
  Structure *pSVar1;
  Category CVar2;
  bool bVar3;
  bool bVar4;
  PrimitiveType PVar5;
  BoundedIntSize BVar6;
  int iVar7;
  pointer pTVar8;
  vector<soul::Type,_std::allocator<soul::Type>_> local_38;
  
  getResolvedDataTypes(&local_38,this);
  pTVar8 = local_38.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    if (pTVar8 == local_38.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_38);
      throwInternalCompilerError("getElementDataType",0x41e);
    }
    iVar7 = (*(e->super_Statement).super_ASTObject._vptr_ASTObject[0x10])(e,pTVar8);
    if ((char)iVar7 != '\0') break;
    pTVar8 = pTVar8 + 1;
  }
  CVar2 = pTVar8->arrayElementCategory;
  bVar3 = pTVar8->isRef;
  bVar4 = pTVar8->isConstant;
  PVar5.type = (pTVar8->primitiveType).type;
  __return_storage_ptr__->category = pTVar8->category;
  __return_storage_ptr__->arrayElementCategory = CVar2;
  __return_storage_ptr__->isRef = bVar3;
  __return_storage_ptr__->isConstant = bVar4;
  __return_storage_ptr__->primitiveType = (PrimitiveType)PVar5.type;
  BVar6 = pTVar8->arrayElementBoundingSize;
  __return_storage_ptr__->boundingSize = pTVar8->boundingSize;
  __return_storage_ptr__->arrayElementBoundingSize = BVar6;
  pSVar1 = (pTVar8->structure).object;
  (__return_storage_ptr__->structure).object = pSVar1;
  if (pSVar1 != (Structure *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Type getElementDataType (Expression& e) const
        {
            for (auto& type : getResolvedDataTypes())
                if (e.canSilentlyCastTo (type))
                    return type;

            SOUL_ASSERT_FALSE;
            return {};
        }